

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O1

void __thiscall QPDFArgParser::argHelp(QPDFArgParser *this,string *p)

{
  __shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2> local_48;
  string local_38;
  
  QPDFLogger::defaultLogger();
  getHelp(&local_38,this,p);
  QPDFLogger::info(local_48._M_ptr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr(&local_48);
  exit(0);
}

Assistant:

void
QPDFArgParser::argHelp(std::string const& p)
{
    QPDFLogger::defaultLogger()->info(getHelp(p));
    exit(0);
}